

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

void start_lisp(void)

{
  LispPTR *pLVar1;
  DLword *pDVar2;
  INTSTAT *intstate;
  DLword *next68k;
  DLword *freeptr;
  
  pLVar1 = NativeAligned4FromLAddr(*INTERRUPTSTATE_word);
  *(ushort *)((long)pLVar1 + 2) = *(ushort *)((long)pLVar1 + 2) & 0xbfff;
  *(ushort *)((long)pLVar1 + 2) = *(ushort *)((long)pLVar1 + 2) & 0x7fff;
  *(ushort *)((long)pLVar1 + 2) = *(ushort *)((long)pLVar1 + 2) & 0xdfff;
  *(ushort *)((long)pLVar1 + 2) = *(ushort *)((long)pLVar1 + 2) & 0xfeff;
  *(undefined2 *)pLVar1 = 0;
  MachineState.tosvalue = 0;
  MachineState.errorexit = 0;
  pDVar2 = NativeAligned2FromStackOffset(InterfacePage->currentfxp);
  MachineState.pvar = pDVar2 + 10;
  pDVar2 = NativeAligned2FromStackOffset(pDVar2[5]);
  next68k = pDVar2;
  if (*(short *)((ulong)pDVar2 ^ 2) != -0x6000) {
    error("Starting Lisp: Next stack block isn\'t free!");
  }
  while (*(short *)((ulong)next68k ^ 2) == -0x6000) {
    MachineState.endofstack = next68k + (int)(uint)*(ushort *)((ulong)(next68k + 1) ^ 2);
    next68k = MachineState.endofstack;
  }
  MachineState.csp = pDVar2 + -2;
  MachineState.ivar =
       NativeAligned2FromStackOffset(*(DLword *)((ulong)(MachineState.pvar + -0xb) ^ 2));
  MachineState.currentfunc = (fnhead *)NativeAligned4FromLAddr(*(LispPTR *)(MachineState.pvar + -8))
  ;
  MachineState.currentpc =
       (ByteCode *)((long)&(MachineState.currentfunc)->na + (long)(int)(uint)MachineState.pvar[-6]);
  int_init();
  dispatch();
  return;
}

Assistant:

void start_lisp(void) {
  DLword *freeptr, *next68k;

/*******************************/
/*  First, turn off any pending interrupts from during VMEMSAVE.	*/
/*  This keeps US from trying to handle OLD interrupts.		*/
/*******************************/
#ifndef INIT
  {
    INTSTAT *intstate = ((INTSTAT *)NativeAligned4FromLAddr(*INTERRUPTSTATE_word));
    intstate->ETHERInterrupt = 0;
    intstate->LogFileIO = 0;
    intstate->IOInterrupt = 0;
    intstate->waitinginterrupt = 0;
    intstate->intcharcode = 0;
  }
#endif /* INIT */

  TopOfStack = 0;
  Error_Exit = 0;

  PVar = NativeAligned2FromStackOffset(InterfacePage->currentfxp) + FRAMESIZE;

  freeptr = next68k = NativeAligned2FromStackOffset(CURRENTFX->nextblock);

  if (GETWORD(next68k) != STK_FSB_WORD) error("Starting Lisp: Next stack block isn't free!");

  while (GETWORD(freeptr) == STK_FSB_WORD) EndSTKP = freeptr = freeptr + GETWORD(freeptr + 1);

  CurrentStackPTR = next68k - 2;

  FastRetCALL;

  /* JRB - The interrupt initialization must be done right before  */
  /*       entering the bytecode dispatch loop; interrupts get     */
  /*       unblocked here 					   */
  int_init();
#ifdef DOS
  _dpmi_lockregion((void *)&dispatch, 32768);
#endif /* DOS */
  dispatch();
}